

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

void SetLineIsoCoords(ON_Line *line,ON_3dPoint *P,ON_3dPoint *Q)

{
  bool bVar1;
  undefined1 local_38 [8];
  ON_3dPoint C;
  ON_3dPoint *Q_local;
  ON_3dPoint *P_local;
  ON_Line *line_local;
  
  C.z = (double)Q;
  bVar1 = GetLineIsoCoordinates(line,*P,(ON_3dPoint *)local_38);
  if (bVar1) {
    if ((((double)local_38 != -1.23432101234321e+308) || (NAN((double)local_38))) &&
       (bVar1 = ON_IsValid((double)local_38), bVar1)) {
      *(double *)C.z = P->x;
    }
    if (((C.x != -1.23432101234321e+308) || (NAN(C.x))) && (bVar1 = ON_IsValid(C.x), bVar1)) {
      *(double *)((long)C.z + 8) = P->y;
    }
    if (((C.y != -1.23432101234321e+308) || (NAN(C.y))) && (bVar1 = ON_IsValid(C.y), bVar1)) {
      *(double *)((long)C.z + 0x10) = P->z;
    }
  }
  return;
}

Assistant:

static void SetLineIsoCoords( const ON_Line& line, const ON_3dPoint& P, ON_3dPoint& Q )
{
  ON_3dPoint C;
  if ( GetLineIsoCoordinates(line,P,C) )
  {
    if ( ON_UNSET_VALUE != C.x && ON_IsValid(C.x) )
      Q.x = P.x;
    if ( ON_UNSET_VALUE != C.y && ON_IsValid(C.y) )
      Q.y = P.y;
    if ( ON_UNSET_VALUE != C.z && ON_IsValid(C.z) )
      Q.z = P.z;
  }
}